

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# productquantizer.cc
# Opt level: O1

void __thiscall
fasttext::ProductQuantizer::addcode
          (ProductQuantizer *this,Vector *x,uint8_t *codes,int32_t t,real alpha)

{
  int iVar1;
  int iVar2;
  real *prVar3;
  ulong uVar4;
  float *pfVar5;
  ulong uVar6;
  ulong uVar7;
  
  iVar1 = this->nsubq_;
  if (0 < (long)iVar1) {
    iVar2 = this->dsub_;
    pfVar5 = (x->data_).mem_;
    uVar7 = 0;
    uVar6 = (long)iVar2;
    do {
      prVar3 = get_centroids(this,(int32_t)uVar7,codes[uVar7 + (long)(t * iVar1)]);
      if (uVar7 == iVar1 - 1) {
        uVar6 = (ulong)(uint)this->lastdsub_;
      }
      if (0 < (int)uVar6) {
        uVar4 = 0;
        do {
          pfVar5[uVar4] = prVar3[uVar4] * alpha + pfVar5[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uVar6 & 0xffffffff) != uVar4);
      }
      uVar7 = uVar7 + 1;
      pfVar5 = pfVar5 + iVar2;
    } while (uVar7 != (long)iVar1);
  }
  return;
}

Assistant:

void ProductQuantizer::addcode(
    Vector& x,
    const uint8_t* codes,
    int32_t t,
    real alpha) const {
  auto d = dsub_;
  const uint8_t* code = codes + nsubq_ * t;
  for (auto m = 0; m < nsubq_; m++) {
    const real* c = get_centroids(m, code[m]);
    if (m == nsubq_ - 1) {
      d = lastdsub_;
    }
    for (auto n = 0; n < d; n++) {
      x[m * dsub_ + n] += alpha * c[n];
    }
  }
}